

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall
ON_NurbsSurface::GetCV(ON_NurbsSurface *this,int i,int j,point_style style,double *Point)

{
  bool bVar1;
  double local_58;
  double w;
  double *pdStack_38;
  int dim;
  double *cv;
  double *Point_local;
  point_style style_local;
  int j_local;
  int i_local;
  ON_NurbsSurface *this_local;
  
  pdStack_38 = CV(this,i,j);
  if (pdStack_38 == (double *)0x0) {
    return false;
  }
  w._4_4_ = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  bVar1 = IsRational(this);
  if (bVar1) {
    local_58 = pdStack_38[w._4_4_];
  }
  else {
    local_58 = 1.0;
  }
  if (style != not_rational) {
    if (style == homogeneous_rational) {
      Point[w._4_4_] = local_58;
      memcpy(Point,pdStack_38,(long)w._4_4_ << 3);
      return true;
    }
    if (style != euclidean_rational) {
      return false;
    }
    Point[w._4_4_] = local_58;
  }
  if ((local_58 == 0.0) && (!NAN(local_58))) {
    return false;
  }
  cv = Point;
  while (w._4_4_ != 0) {
    *cv = *pdStack_38 * (1.0 / local_58);
    w._4_4_ = w._4_4_ + -1;
    pdStack_38 = pdStack_38 + 1;
    cv = cv + 1;
  }
  return true;
}

Assistant:

bool 
ON_NurbsSurface::GetCV( int i, int j, ON::point_style style, double* Point ) const
{
  const double* cv = CV(i,j);
  if ( !cv )
    return false;
  int dim = Dimension();
  double w = ( IsRational() ) ? cv[dim] : 1.0;
  switch(style) {
  case ON::euclidean_rational:
    Point[dim] = w;
    // no break here
  case ON::not_rational:
    if ( w == 0.0 )
      return false;
    w = 1.0/w;
    while(dim--) *Point++ = *cv++ * w;
    break;
  case ON::homogeneous_rational:
    Point[dim] = w;
    memcpy( Point, cv, dim*sizeof(*Point) );
    break;
  default:
    return false;
  }
  return true;
}